

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3_174.c
# Opt level: O2

void OPL3_SlotGeneratePhase(opl3_slot_conflict *slot,Bit16u phase)

{
  uint uVar1;
  int iVar2;
  ushort uVar3;
  
  if ((slot->maskzero & phase) == 0) {
    iVar2 = (uint)phase << (slot->signpos & 0x1f);
    uVar1 = (uint)phase << (slot->phaseshift & 0x1f);
    if (slot->phaseshift < 2) {
      uVar1 = (uint)logsinrom[uVar1 & 0x1ff];
    }
    else {
      uVar1 = ((uVar1 ^ iVar2 >> 0x1f) & 0x3ff) << 3;
    }
    uVar1 = uVar1 + (int)slot->eg_out;
    uVar3 = exprom[uVar1 & 0xff] >> ((byte)(uVar1 >> 8) & 0x1f) ^ (ushort)(iVar2 >> 0x1f);
  }
  else {
    uVar3 = 0;
  }
  slot->out = uVar3;
  return;
}

Assistant:

static void OPL3_SlotGeneratePhase(opl3_slot *slot, Bit16u phase)
{
    Bit32u neg, level;
    Bit8u  phaseshift;

    /* Fast paths for mute segments */
    if (phase & slot->maskzero)
    {
        slot->out = 0;
        return;
    }

    neg = (Bit32s)((Bit32u)phase << slot->signpos) >> 31;
    phaseshift = slot->phaseshift;
    level = slot->eg_out;

    phase <<= phaseshift;
    if (phaseshift <= 1)
    {
        level += logsinrom[phase & 0x1ff];
    }
    else
    {
        level += ((phase ^ neg) & 0x3ff) << 3;
    }
    slot->out = exprom[level & 0xff] >> (level >> 8) ^ neg;
}